

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::work_thread::details::
work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::body
          (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
           *this)

{
  extraction_result_t eVar1;
  pthread_t pVar2;
  demand_container_t demands;
  
  pVar2 = pthread_self();
  *(pthread_t *)(this + 0x78) = pVar2;
  std::_Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::_Deque_base
            (&demands.
              super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>
            );
  eVar1 = no_demands;
  while (*(int *)(this + 8) == 1) {
    if (demands.
        super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        demands.
        super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      eVar1 = demand_queue_details::
              queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
              ::pop((queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                     *)(this + 0x10),&demands,(demands_counter_t *)(this + 0x80));
    }
    if (eVar1 == demand_extracted) {
      no_activity_tracking_impl_t::serve_demands_block((no_activity_tracking_impl_t *)this,&demands)
      ;
    }
  }
  std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::~deque(&demands);
  return;
}

Assistant:

void
	body()
	{
		// Store current thread ID to attribute to avoid thread ID
		// request on every event execution.
		this->m_thread_id = so_5::query_current_thread_id();

		// Local demands queue.
		demand_container_t demands;

		auto result = extraction_result_t::no_demands;

		while( status_t::working == this->m_status )
		{
			// If the local queue is empty then we should try
			// to get new demands.
			if( demands.empty() )
				result = this->m_queue.pop( demands, this->m_demands_count );

			// Serve demands if any.
			if( extraction_result_t::demand_extracted == result )
				this->serve_demands_block( demands );
		}
	}